

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyUtil.c
# Opt level: O0

void Ivy_ManPrintVerbose(Ivy_Man_t *p,int fHaig)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Ivy_Obj_t *pIVar4;
  Vec_Int_t *p_00;
  char *pcVar5;
  bool bVar6;
  int local_2c;
  Ivy_Obj_t *pIStack_28;
  int i;
  Ivy_Obj_t *pObj;
  Vec_Int_t *vNodes;
  int fHaig_local;
  Ivy_Man_t *p_local;
  
  printf("PIs: ");
  for (local_2c = 0; iVar3 = Vec_PtrSize(p->vPis), local_2c < iVar3; local_2c = local_2c + 1) {
    pIStack_28 = (Ivy_Obj_t *)Vec_PtrEntry(p->vPis,local_2c);
    printf(" %d",(ulong)(uint)pIStack_28->Id);
  }
  printf("\n");
  printf("POs: ");
  for (local_2c = 0; iVar3 = Vec_PtrSize(p->vPos), local_2c < iVar3; local_2c = local_2c + 1) {
    pIStack_28 = (Ivy_Obj_t *)Vec_PtrEntry(p->vPos,local_2c);
    printf(" %d",(ulong)(uint)pIStack_28->Id);
  }
  printf("\n");
  printf("Latches: ");
  for (local_2c = 0; iVar3 = Vec_PtrSize(p->vObjs), local_2c < iVar3; local_2c = local_2c + 1) {
    pIStack_28 = (Ivy_Obj_t *)Vec_PtrEntry(p->vObjs,local_2c);
    if ((pIStack_28 != (Ivy_Obj_t *)0x0) && (iVar3 = Ivy_ObjIsLatch(pIStack_28), iVar3 != 0)) {
      uVar1 = pIStack_28->Id;
      pIVar4 = Ivy_ObjFanin0(pIStack_28);
      uVar2 = pIVar4->Id;
      iVar3 = Ivy_ObjFaninC0(pIStack_28);
      pcVar5 = " ";
      if (iVar3 != 0) {
        pcVar5 = "\'";
      }
      printf(" %d=%d%s",(ulong)uVar1,(ulong)uVar2,pcVar5);
    }
  }
  printf("\n");
  p_00 = Ivy_ManDfsSeq(p,(Vec_Int_t **)0x0);
  local_2c = 0;
  while( true ) {
    iVar3 = Vec_IntSize(p_00);
    bVar6 = false;
    if (local_2c < iVar3) {
      iVar3 = Vec_IntEntry(p_00,local_2c);
      pIStack_28 = Ivy_ManObj(p,iVar3);
      bVar6 = pIStack_28 != (Ivy_Obj_t *)0x0;
    }
    if (!bVar6) break;
    Ivy_ObjPrintVerbose(p,pIStack_28,fHaig);
    printf("\n");
    local_2c = local_2c + 1;
  }
  printf("\n");
  Vec_IntFree(p_00);
  return;
}

Assistant:

void Ivy_ManPrintVerbose( Ivy_Man_t * p, int fHaig )
{
    Vec_Int_t * vNodes;
    Ivy_Obj_t * pObj;
    int i;
    printf( "PIs: " );
    Ivy_ManForEachPi( p, pObj, i )
        printf( " %d", pObj->Id );
    printf( "\n" );
    printf( "POs: " );
    Ivy_ManForEachPo( p, pObj, i )
        printf( " %d", pObj->Id );
    printf( "\n" );
    printf( "Latches: " );
    Ivy_ManForEachLatch( p, pObj, i )
        printf( " %d=%d%s", pObj->Id, Ivy_ObjFanin0(pObj)->Id, (Ivy_ObjFaninC0(pObj)? "\'" : " ") );
    printf( "\n" );
    vNodes = Ivy_ManDfsSeq( p, NULL );
    Ivy_ManForEachNodeVec( p, vNodes, pObj, i )
        Ivy_ObjPrintVerbose( p, pObj, fHaig ), printf( "\n" );
    printf( "\n" );
    Vec_IntFree( vNodes );
}